

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

int __thiscall zmq::address_t::to_string(address_t *this,string *addr_)

{
  udp_address_t *puVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  string asStack_1b8 [32];
  stringstream s;
  ostream local_188 [376];
  
  bVar2 = std::operator==(&this->protocol,"tcp");
  if ((bVar2) && ((this->resolved).tcp_addr != (tcp_address_t *)0x0)) {
    iVar3 = tcp_address_t::to_string((this->resolved).tcp_addr,addr_);
    return iVar3;
  }
  bVar2 = std::operator==(&this->protocol,"udp");
  if ((bVar2) && (puVar1 = (this->resolved).udp_addr, puVar1 != (udp_address_t *)0x0)) {
    iVar3 = (*puVar1->_vptr_udp_address_t[2])(puVar1,addr_);
    return iVar3;
  }
  bVar2 = std::operator==(&this->protocol,"ipc");
  if ((bVar2) && ((this->resolved).ipc_addr != (ipc_address_t *)0x0)) {
    iVar3 = ipc_address_t::to_string((this->resolved).ipc_addr,addr_);
    return iVar3;
  }
  bVar2 = std::operator==(&this->protocol,"tipc");
  if ((bVar2) && ((this->resolved).tipc_addr != (tipc_address_t *)0x0)) {
    iVar3 = tipc_address_t::to_string((this->resolved).tipc_addr,addr_);
    return iVar3;
  }
  if (((this->protocol)._M_string_length == 0) || ((this->address)._M_string_length == 0)) {
    addr_->_M_string_length = 0;
    *(addr_->_M_dataplus)._M_p = '\0';
    iVar3 = -1;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&s);
    poVar4 = std::operator<<(local_188,(string *)this);
    poVar4 = std::operator<<(poVar4,"://");
    std::operator<<(poVar4,(string *)&this->address);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)addr_,asStack_1b8);
    std::__cxx11::string::~string(asStack_1b8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&s);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int zmq::address_t::to_string (std::string &addr_) const
{
    if (protocol == protocol_name::tcp && resolved.tcp_addr)
        return resolved.tcp_addr->to_string (addr_);
    if (protocol == protocol_name::udp && resolved.udp_addr)
        return resolved.udp_addr->to_string (addr_);
#ifdef ZMQ_HAVE_WS
    if (protocol == protocol_name::ws && resolved.ws_addr)
        return resolved.ws_addr->to_string (addr_);
#endif
#ifdef ZMQ_HAVE_WSS
    if (protocol == protocol_name::wss && resolved.ws_addr)
        return resolved.ws_addr->to_string (addr_);
#endif
#if defined ZMQ_HAVE_IPC
    if (protocol == protocol_name::ipc && resolved.ipc_addr)
        return resolved.ipc_addr->to_string (addr_);
#endif
#if defined ZMQ_HAVE_TIPC
    if (protocol == protocol_name::tipc && resolved.tipc_addr)
        return resolved.tipc_addr->to_string (addr_);
#endif
#if defined ZMQ_HAVE_VMCI
    if (protocol == protocol_name::vmci && resolved.vmci_addr)
        return resolved.vmci_addr->to_string (addr_);
#endif

    if (!protocol.empty () && !address.empty ()) {
        std::stringstream s;
        s << protocol << "://" << address;
        addr_ = s.str ();
        return 0;
    }
    addr_.clear ();
    return -1;
}